

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

vm_tadsobj_prop * __thiscall vm_tadsobj_hdr::find_prop_entry(vm_tadsobj_hdr *this,uint prop)

{
  vm_tadsobj_prop **ppvVar1;
  uint uVar2;
  uint in_ESI;
  vm_tadsobj_hdr *in_RDI;
  vm_tadsobj_prop *entry;
  vm_tadsobj_prop *local_20;
  
  ppvVar1 = in_RDI->hash_arr;
  uVar2 = calc_hash(in_RDI,in_ESI);
  local_20 = ppvVar1[uVar2];
  while( true ) {
    if (local_20 == (vm_tadsobj_prop *)0x0) {
      return (vm_tadsobj_prop *)0x0;
    }
    if (local_20->prop == in_ESI) break;
    local_20 = local_20->nxt;
  }
  return local_20;
}

Assistant:

vm_tadsobj_prop *vm_tadsobj_hdr::find_prop_entry(uint prop)
{
    /* scan the list of entries in this bucket */
    for (vm_tadsobj_prop *entry = hash_arr[calc_hash(prop)] ;
         entry != 0 ; entry = entry->nxt)
    {
        /* if this entry matches, return it */
        if (entry->prop == prop)
            return entry;
    }

    /* didn't find it */
    return 0;
}